

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int cuddSwapInPlace(DdManager *table,int x,int y)

{
  DdHalfWord *pDVar1;
  DdHalfWord x_00;
  DdHalfWord y_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdHalfWord DVar5;
  DdHalfWord DVar6;
  Cudd_VariableType CVar7;
  Cudd_LazyGroupType CVar8;
  DdSubtable *pDVar9;
  DdNode **ppDVar10;
  DdManager *pDVar11;
  int *piVar12;
  uint uVar13;
  DdNode *pDVar14;
  DdManager *pDVar15;
  _func_void_long *p_Var16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  DdNode **ppDVar22;
  DdNode *pDVar23;
  DdNode *pDVar24;
  DdNode **ppDVar25;
  DdNode *pDVar26;
  ulong uVar27;
  DdManager *pDVar28;
  DdNode *pDVar29;
  DdNode *pDVar30;
  DdNode *pDVar31;
  DdNode *pDVar32;
  DdNode **ppDVar33;
  uint uVar34;
  uint uVar35;
  DdManager *pDVar36;
  DdNode *pDVar37;
  bool bVar38;
  int local_dc;
  uint local_b8;
  ulong local_a0;
  
  ddTotalNumberSwapping = ddTotalNumberSwapping + 1;
  pDVar9 = table->subtables;
  x_00 = table->invperm[x];
  ppDVar33 = pDVar9[x].nodelist;
  uVar20 = pDVar9[x].keys;
  uVar35 = pDVar9[x].slots;
  uVar27 = (ulong)uVar35;
  iVar19 = pDVar9[x].shift;
  y_00 = table->invperm[y];
  ppDVar10 = pDVar9[y].nodelist;
  uVar2 = pDVar9[y].keys;
  uVar3 = pDVar9[y].slots;
  iVar4 = pDVar9[y].shift;
  iVar17 = cuddTestInteract(table,x_00,y_00);
  local_b8 = uVar2;
  uVar34 = uVar20;
  local_dc = iVar19;
  if (iVar17 == 0) goto LAB_0080284a;
  DVar5 = table->vars[(int)x_00]->ref;
  DVar6 = table->vars[(int)y_00]->ref;
  if ((int)uVar20 < (int)uVar35) {
    if ((int)(uVar35 * 4) < (int)uVar20 || uVar35 != table->initSlots) goto LAB_0080210d;
LAB_00802072:
    if ((int)uVar35 < 1) {
      uVar34 = 0;
      pDVar36 = (DdManager *)0x0;
    }
    else {
      uVar21 = 0;
      pDVar36 = (DdManager *)0x0;
      uVar34 = 0;
      do {
        ppDVar22 = ppDVar33 + uVar21;
        pDVar28 = (DdManager *)*ppDVar22;
        while (pDVar11 = pDVar28, pDVar11 != table) {
          pDVar28 = (DdManager *)(pDVar11->sentinel).next;
          if ((((pDVar11->sentinel).type.kids.T)->index == y_00) ||
             (*(DdHalfWord *)((ulong)(pDVar11->sentinel).type.kids.E & 0xfffffffffffffffe) == y_00))
          {
            (pDVar11->sentinel).index = y_00;
            (pDVar11->sentinel).next = &pDVar36->sentinel;
            pDVar36 = pDVar11;
          }
          else {
            uVar34 = uVar34 + 1;
            *ppDVar22 = &pDVar11->sentinel;
            ppDVar22 = &(pDVar11->sentinel).next;
          }
        }
        *ppDVar22 = &table->sentinel;
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar27);
    }
  }
  else {
    if (uVar20 == uVar35 * 4 || SBORROW4(uVar20,uVar35 * 4) != (int)(uVar20 + uVar35 * -4) < 0)
    goto LAB_00802072;
LAB_0080210d:
    if ((int)uVar35 < 1) {
      uVar34 = 0;
      local_a0 = 0;
      pDVar36 = (DdManager *)0x0;
      pDVar28 = (DdManager *)0x0;
    }
    else {
      local_a0 = 0;
      pDVar28 = (DdManager *)0x0;
      pDVar36 = (DdManager *)0x0;
      uVar34 = 0;
      do {
        pDVar11 = (DdManager *)ppDVar33[local_a0];
        while (pDVar15 = pDVar11, pDVar15 != table) {
          pDVar11 = (DdManager *)(pDVar15->sentinel).next;
          if ((((pDVar15->sentinel).type.kids.T)->index == y_00) ||
             (*(DdHalfWord *)((ulong)(pDVar15->sentinel).type.kids.E & 0xfffffffffffffffe) == y_00))
          {
            (pDVar15->sentinel).index = y_00;
            (pDVar15->sentinel).next = &pDVar36->sentinel;
            pDVar36 = pDVar15;
          }
          else {
            (pDVar15->sentinel).next = &pDVar28->sentinel;
            uVar34 = uVar34 + 1;
            pDVar28 = pDVar15;
          }
        }
        local_a0 = local_a0 + 1;
      } while (local_a0 != uVar27);
    }
    p_Var16 = Extra_UtilMMoutOfMemory;
    uVar18 = uVar35 * 4;
    uVar21 = uVar27;
    while (uVar13 = (uint)uVar21, uVar18 < uVar20) {
      local_dc = local_dc + -1;
      uVar21 = (ulong)(uVar13 * 2);
      uVar18 = uVar13 * 8;
    }
    if (uVar20 < uVar13) {
      do {
        if ((uint)uVar21 <= table->initSlots) break;
        local_dc = local_dc + 1;
        uVar18 = (uint)uVar21 >> 1;
        uVar21 = (ulong)uVar18;
      } while (uVar20 < uVar18);
    }
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    ppDVar22 = (DdNode **)malloc(uVar21 << 3);
    Extra_UtilMMoutOfMemory = p_Var16;
    if (ppDVar22 == (DdNode **)0x0) {
      fprintf((FILE *)table->err,"Unable to resize subtable %d for lack of memory\n",local_a0);
      ppDVar22 = ppDVar33;
      uVar21 = uVar27;
      local_dc = iVar19;
    }
    else {
      iVar19 = (int)uVar21 - uVar35;
      uVar18 = table->slots + iVar19;
      table->slots = uVar18;
      table->minDead = (uint)(long)((double)uVar18 * table->gcFrac);
      uVar35 = uVar18 * 4;
      if (table->maxCacheHard <= uVar18 * 4) {
        uVar35 = table->maxCacheHard;
      }
      table->cacheSlack = uVar35 + table->cacheSlots * -2;
      table->memused = table->memused + (long)iVar19 * 8;
      if (ppDVar33 != (DdNode **)0x0) {
        free(ppDVar33);
      }
    }
    uVar35 = (uint)uVar21;
    if (0 < (int)uVar35) {
      uVar27 = 0;
      do {
        ppDVar22[uVar27] = &table->sentinel;
        uVar27 = uVar27 + 1;
      } while (uVar21 != uVar27);
    }
    while (ppDVar33 = ppDVar22, pDVar28 != (DdManager *)0x0) {
      pDVar30 = (pDVar28->sentinel).type.kids.T;
      pDVar29 = (pDVar28->sentinel).type.kids.E;
      pDVar11 = (DdManager *)(pDVar28->sentinel).next;
      ppDVar33 = ppDVar22 +
                 (int)((((uint)pDVar29 & 1) +
                        *(int *)(((ulong)pDVar29 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)pDVar30 & 1) +
                       *(int *)(((ulong)pDVar30 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)local_dc & 0x1f));
      do {
        ppDVar25 = ppDVar33;
        pDVar32 = *ppDVar25;
        ppDVar33 = &pDVar32->next;
      } while (pDVar30 < (pDVar32->type).kids.T);
      if ((pDVar30 == (pDVar32->type).kids.T) && (pDVar29 < (pDVar32->type).kids.E)) {
        do {
          pDVar23 = pDVar32;
          pDVar32 = pDVar23->next;
          if (pDVar30 != (pDVar32->type).kids.T) break;
        } while (pDVar29 < (pDVar32->type).kids.E);
        ppDVar25 = &pDVar23->next;
      }
      (pDVar28->sentinel).next = *ppDVar25;
      *ppDVar25 = &pDVar28->sentinel;
      pDVar28 = pDVar11;
    }
  }
  while (pDVar36 != (DdManager *)0x0) {
    pDVar30 = (pDVar36->sentinel).type.kids.T;
    pDVar29 = pDVar30;
    pDVar32 = pDVar30;
    if (pDVar30->index == y_00) {
      pDVar29 = (pDVar30->type).kids.T;
      pDVar32 = (pDVar30->type).kids.E;
    }
    pDVar23 = (pDVar36->sentinel).type.kids.E;
    pDVar37 = (DdNode *)((ulong)pDVar23 & 0xfffffffffffffffe);
    pDVar31 = pDVar37;
    pDVar26 = pDVar37;
    if (pDVar37->index == y_00) {
      pDVar26 = (pDVar37->type).kids.T;
      pDVar31 = (pDVar37->type).kids.E;
    }
    pDVar28 = (DdManager *)(pDVar36->sentinel).next;
    pDVar24 = (DdNode *)((ulong)pDVar31 ^ 1);
    pDVar14 = (DdNode *)((ulong)pDVar26 ^ 1);
    if (((ulong)pDVar23 & 1) == 0) {
      pDVar24 = pDVar31;
      pDVar14 = pDVar26;
    }
    pDVar30->ref = pDVar30->ref - 1;
    pDVar30 = pDVar29;
    pDVar23 = pDVar29;
    if (pDVar29 != pDVar14) {
      ppDVar22 = ppDVar33 +
                 (int)((((uint)pDVar14 & 1) +
                        (int)((DdNode *)((ulong)pDVar14 & 0xfffffffffffffffe))->Id * 2 +
                       (((uint)pDVar29 & 1) +
                       *(int *)(((ulong)pDVar29 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)local_dc & 0x1f));
      do {
        ppDVar25 = ppDVar22;
        pDVar30 = *ppDVar25;
        ppDVar22 = &pDVar30->next;
      } while (pDVar29 < (pDVar30->type).kids.T);
      bVar38 = pDVar29 == (pDVar30->type).kids.T;
      if (bVar38) {
        if (pDVar14 < (pDVar30->type).kids.E) {
          do {
            pDVar23 = pDVar30;
            pDVar30 = pDVar23->next;
            bVar38 = pDVar29 == (pDVar30->type).kids.T;
            if (!bVar38) {
              ppDVar25 = &pDVar23->next;
              goto LAB_00802478;
            }
          } while (pDVar14 < (pDVar30->type).kids.E);
          ppDVar25 = &pDVar23->next;
        }
        if ((bVar38) && (pDVar23 = pDVar30, (pDVar30->type).kids.E == pDVar14)) goto LAB_008024f3;
      }
LAB_00802478:
      pDVar23 = cuddDynamicAllocNode(table);
      if (pDVar23 == (DdNode *)0x0) goto LAB_008027d5;
      pDVar23->index = x_00;
      pDVar23->ref = 1;
      (pDVar23->type).kids.T = pDVar29;
      (pDVar23->type).kids.E = pDVar14;
      uVar34 = uVar34 + 1;
      pDVar23->next = *ppDVar25;
      *ppDVar25 = pDVar23;
      pDVar29->ref = pDVar29->ref + 1;
      pDVar30 = (DdNode *)((ulong)pDVar14 & 0xfffffffffffffffe);
    }
LAB_008024f3:
    pDVar30->ref = pDVar30->ref + 1;
    (pDVar36->sentinel).type.kids.T = pDVar23;
    pDVar37->ref = pDVar37->ref - 1;
    if (pDVar32 == pDVar24) {
      piVar12 = (int *)(((ulong)pDVar24 & 0xfffffffffffffffe) + 4);
      *piVar12 = *piVar12 + 1;
    }
    else {
      pDVar29 = (DdNode *)((ulong)pDVar32 & 0xfffffffffffffffe);
      pDVar30 = (DdNode *)((ulong)pDVar24 ^ 1);
      if (((ulong)pDVar32 & 1) == 0) {
        pDVar29 = pDVar32;
        pDVar30 = pDVar24;
      }
      ppDVar22 = ppDVar33 +
                 (int)((((uint)pDVar30 & 1) +
                        (int)((DdNode *)((ulong)pDVar30 & 0xfffffffffffffffe))->Id * 2 +
                       (((uint)pDVar29 & 1) +
                       *(int *)(((ulong)pDVar29 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)local_dc & 0x1f));
      do {
        ppDVar25 = ppDVar22;
        pDVar26 = *ppDVar25;
        ppDVar22 = &pDVar26->next;
      } while (pDVar29 < (pDVar26->type).kids.T);
      bVar38 = pDVar29 == (pDVar26->type).kids.T;
      if (bVar38) {
        if (pDVar30 < (pDVar26->type).kids.E) {
          do {
            pDVar31 = pDVar26;
            pDVar26 = pDVar31->next;
            bVar38 = pDVar29 == (pDVar26->type).kids.T;
            if (!bVar38) {
              ppDVar25 = &pDVar31->next;
              goto LAB_00802580;
            }
          } while (pDVar30 < (pDVar26->type).kids.E);
          ppDVar25 = &pDVar31->next;
        }
        if ((!bVar38) || (pDVar24 = pDVar26, (pDVar26->type).kids.E != pDVar30)) goto LAB_00802580;
      }
      else {
LAB_00802580:
        pDVar24 = cuddDynamicAllocNode(table);
        if (pDVar24 == (DdNode *)0x0) {
LAB_008027d5:
          fwrite("Error: cuddSwapInPlace out of memory\n",0x25,1,(FILE *)table->err);
          return 0;
        }
        pDVar24->index = x_00;
        pDVar24->ref = 1;
        (pDVar24->type).kids.T = pDVar29;
        (pDVar24->type).kids.E = pDVar30;
        uVar34 = uVar34 + 1;
        pDVar24->next = *ppDVar25;
        *ppDVar25 = pDVar24;
        pDVar29->ref = pDVar29->ref + 1;
        pDVar26 = (DdNode *)((ulong)pDVar30 & 0xfffffffffffffffe);
      }
      pDVar26->ref = pDVar26->ref + 1;
      if (((ulong)pDVar32 & 1) != 0) {
        pDVar24 = (DdNode *)((ulong)pDVar24 ^ 1);
      }
    }
    (pDVar36->sentinel).type.kids.E = pDVar24;
    ppDVar22 = ppDVar10 +
               (int)((((uint)pDVar24 & 1) +
                      *(int *)(((ulong)pDVar24 & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar23 & 1) +
                     *(int *)(((ulong)pDVar23 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                     0x40f1f9 >> ((byte)iVar4 & 0x1f));
    do {
      ppDVar25 = ppDVar22;
      pDVar30 = *ppDVar25;
      ppDVar22 = &pDVar30->next;
    } while (pDVar23 < (pDVar30->type).kids.T);
    if ((pDVar23 == (pDVar30->type).kids.T) && (pDVar24 < (pDVar30->type).kids.E)) {
      do {
        pDVar29 = pDVar30;
        pDVar30 = pDVar29->next;
        if (pDVar23 != (pDVar30->type).kids.T) break;
      } while (pDVar24 < (pDVar30->type).kids.E);
      ppDVar25 = &pDVar29->next;
    }
    (pDVar36->sentinel).next = *ppDVar25;
    *ppDVar25 = &pDVar36->sentinel;
    local_b8 = local_b8 + 1;
    pDVar36 = pDVar28;
  }
  if (0 < (int)uVar3) {
    uVar27 = 0;
    do {
      ppDVar22 = ppDVar10 + uVar27;
      pDVar36 = (DdManager *)*ppDVar22;
      while (pDVar36 != table) {
        pDVar28 = (DdManager *)(pDVar36->sentinel).next;
        if ((pDVar36->sentinel).ref == 0) {
          pDVar1 = &((pDVar36->sentinel).type.kids.T)->ref;
          *pDVar1 = *pDVar1 - 1;
          piVar12 = (int *)(((ulong)(pDVar36->sentinel).type.kids.E & 0xfffffffffffffffe) + 4);
          *piVar12 = *piVar12 + -1;
          (pDVar36->sentinel).next = table->nextFree;
          table->nextFree = &pDVar36->sentinel;
          local_b8 = local_b8 - 1;
          pDVar36 = pDVar28;
        }
        else {
          *ppDVar22 = &pDVar36->sentinel;
          ppDVar22 = &(pDVar36->sentinel).next;
          pDVar36 = pDVar28;
        }
      }
      *ppDVar22 = &table->sentinel;
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar3);
  }
  table->isolated =
       (-(uint)(DVar6 == 1) - (uint)(DVar5 == 1)) + (uint)(table->vars[(int)x_00]->ref == 1) +
       table->isolated + (uint)(table->vars[(int)y_00]->ref == 1);
LAB_0080284a:
  pDVar9 = table->subtables;
  pDVar9[x].nodelist = ppDVar10;
  pDVar9[x].slots = uVar3;
  pDVar9[x].shift = iVar4;
  pDVar9[x].keys = local_b8;
  pDVar9[x].maxKeys = uVar3 << 2;
  iVar19 = pDVar9[x].bindVar;
  pDVar9[x].bindVar = pDVar9[y].bindVar;
  pDVar9[y].bindVar = iVar19;
  CVar7 = pDVar9[x].varType;
  pDVar9[x].varType = pDVar9[y].varType;
  pDVar9[y].varType = CVar7;
  iVar19 = pDVar9[x].pairIndex;
  pDVar9[x].pairIndex = pDVar9[y].pairIndex;
  pDVar9[y].pairIndex = iVar19;
  iVar19 = pDVar9[x].varHandled;
  pDVar9[x].varHandled = pDVar9[y].varHandled;
  pDVar9[y].varHandled = iVar19;
  CVar8 = pDVar9[x].varToBeGrouped;
  pDVar9[x].varToBeGrouped = pDVar9[y].varToBeGrouped;
  pDVar9[y].varToBeGrouped = CVar8;
  pDVar9[y].nodelist = ppDVar33;
  pDVar9[y].slots = uVar35;
  pDVar9[y].shift = local_dc;
  pDVar9[y].keys = uVar34;
  pDVar9[y].maxKeys = uVar35 << 2;
  piVar12 = table->perm;
  piVar12[(int)x_00] = y;
  piVar12[(int)y_00] = x;
  piVar12 = table->invperm;
  piVar12[x] = y_00;
  piVar12[y] = x_00;
  uVar20 = (local_b8 - (uVar2 + uVar20)) + uVar34 + table->keys;
  table->keys = uVar20;
  return uVar20 - table->isolated;
}

Assistant:

int
cuddSwapInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    Cudd_VariableType varType;
    Cudd_LazyGroupType groupType;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_DEBUG
    int    count,idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    ddTotalNumberSwapping++;

    /* Get parameters of x subtable. */
    xindex = table->invperm[x];
    xlist = table->subtables[x].nodelist;
    oldxkeys = table->subtables[x].keys;
    xslots = table->subtables[x].slots;
    xshift = table->subtables[x].shift;

    /* Get parameters of y subtable. */
    yindex = table->invperm[y];
    ylist = table->subtables[y].nodelist;
    oldykeys = table->subtables[y].keys;
    yslots = table->subtables[y].slots;
    yshift = table->subtables[y].shift;

    if (!cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNISwaps++;
#endif
        newxkeys = oldxkeys;
        newykeys = oldykeys;
    } else {
        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer that do not depend on
        ** y will stay there; the others are put in a chain.
        ** The chain is handled as a LIFO; g points to the beginning.
        */
        g = NULL;
        if ((oldxkeys >= xslots || (unsigned) xslots == table->initSlots) &&
            oldxkeys <= DD_MAX_SUBTABLE_DENSITY * xslots) {
            for (i = 0; i < xslots; i++) {
                previousP = &(xlist[i]);
                f = *previousP;
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        newxkeys++;
                        *previousP = f;
                        previousP = &(f->next);
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
                *previousP = sentinel;
            } /* for each slot of the x subtable */
        } else {                /* resize xlist */
            DdNode *h = NULL;
            DdNodePtr *newxlist;
            unsigned int newxslots;
            int newxshift;
            /* Empty current xlist. Nodes that stay go to list h;
            ** nodes that move go to list g. */
            for (i = 0; i < xslots; i++) {
                f = xlist[i];
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        f->next = h;
                        h = f;
                        newxkeys++;
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
            } /* for each slot of the x subtable */
            /* Decide size of new subtable. */
            newxshift = xshift;
            newxslots = xslots;
            while ((unsigned) oldxkeys > DD_MAX_SUBTABLE_DENSITY * newxslots) {
                newxshift--;
                newxslots <<= 1;
            }
            while ((unsigned) oldxkeys < newxslots &&
                   newxslots > table->initSlots) {
                newxshift++;
                newxslots >>= 1;
            }
            /* Try to allocate new table. Be ready to back off. */
            saveHandler = MMoutOfMemory;
            MMoutOfMemory = Cudd_OutOfMem;
            newxlist = ABC_ALLOC(DdNodePtr, newxslots);
            MMoutOfMemory = saveHandler;
            if (newxlist == NULL) {
                (void) fprintf(table->err, "Unable to resize subtable %d for lack of memory\n", i);
                newxlist = xlist;
                newxslots = xslots;
                newxshift = xshift;
            } else {
                table->slots += ((int) newxslots - xslots);
                table->minDead = (unsigned)
                    (table->gcFrac * (double) table->slots);
                table->cacheSlack = (int)
                    ddMin(table->maxCacheHard, DD_MAX_CACHE_TO_SLOTS_RATIO
                          * table->slots) - 2 * (int) table->cacheSlots;
                table->memused +=
                    ((int) newxslots - xslots) * sizeof(DdNodePtr);
                ABC_FREE(xlist);
                xslots =  newxslots;
                xshift = newxshift;
                xlist = newxlist;
            }
            /* Initialize new subtable. */
            for (i = 0; i < xslots; i++) {
                xlist[i] = sentinel;
            }
            /* Move nodes that were parked in list h to their new home. */
            f = h;
            while (f != NULL) {
                next = f->next;
                f1 = cuddT(f);
                f0 = cuddE(f);
                /* Check xlist for pair (f11,f01). */
                posn = ddHash(cuddF2L(f1), cuddF2L(f0), xshift);
                /* For each element tmp in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                tmp = *previousP;
                while (f1 < cuddT(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                while (f1 == cuddT(tmp) && f0 < cuddE(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                f->next = *previousP;
                *previousP = f;
                f = next;
            }
        }

#ifdef DD_COUNT
        table->swapSteps += oldxkeys - newxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g. Their index has been
        ** already changed to yindex.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f01) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check xlist for triple (xindex,f11,f01). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f01), xshift);
                /* For each element newf1 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f01 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f01) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddSwapOutOfMem;
                    newf1->index = xindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f01;
                    /* Insert newf1 in the collision list xlist[posn];
                    ** increase the ref counts of f11 and f01.
                    */
                    newxkeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f01);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* Decrease ref count of f0. */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* Create the new E child. */
            if (f10 == f00) {
                newf0 = f00;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f10 is regular */
                newcomplement = Cudd_IsComplement(f10);
                if (newcomplement) {
                    f10 = Cudd_Not(f10);
                    f00 = Cudd_Not(f00);
                }
                /* Check xlist for triple (xindex,f10,f00). */
                posn = ddHash(cuddF2L(f10), cuddF2L(f00), xshift);
                /* For each element newf0 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf0 = *previousP;
                while (f10 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f10 == cuddT(newf0) && f00 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f10 && cuddE(newf0) == f00) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddSwapOutOfMem;
                    newf0->index = xindex; newf0->ref = 1;
                    cuddT(newf0) = f10;
                    cuddE(newf0) = f00;
                    /* Insert newf0 in the collision list xlist[posn];
                    ** increase the ref counts of f10 and f00.
                    */
                    newxkeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f10->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Insert the modified f in ylist.
            ** The modified f does not already exists in ylist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), yshift);
            newykeys++;
            previousP = &(ylist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for i */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Swapping %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            (void) fprintf(table->out,
                           "Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",
                           oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of ylist\twrong id's = %d\n",
                           idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys) {
            (void) fprintf(table->out,
                           "Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",
                           oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of xlist\twrong id's = %d\n",
                           idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;
    }

    /* Set the appropriate fields in table. */
    table->subtables[x].nodelist = ylist;
    table->subtables[x].slots = yslots;
    table->subtables[x].shift = yshift;
    table->subtables[x].keys = newykeys;
    table->subtables[x].maxKeys = yslots * DD_MAX_SUBTABLE_DENSITY;
    i = table->subtables[x].bindVar;
    table->subtables[x].bindVar = table->subtables[y].bindVar;
    table->subtables[y].bindVar = i;
    /* Adjust filds for lazy sifting. */
    varType = table->subtables[x].varType;
    table->subtables[x].varType = table->subtables[y].varType;
    table->subtables[y].varType = varType;
    i = table->subtables[x].pairIndex;
    table->subtables[x].pairIndex = table->subtables[y].pairIndex;
    table->subtables[y].pairIndex = i;
    i = table->subtables[x].varHandled;
    table->subtables[x].varHandled = table->subtables[y].varHandled;
    table->subtables[y].varHandled = i;
    groupType = table->subtables[x].varToBeGrouped;
    table->subtables[x].varToBeGrouped = table->subtables[y].varToBeGrouped;
    table->subtables[y].varToBeGrouped = groupType;

    table->subtables[y].nodelist = xlist;
    table->subtables[y].slots = xslots;
    table->subtables[y].shift = xshift;
    table->subtables[y].keys = newxkeys;
    table->subtables[y].maxKeys = xslots * DD_MAX_SUBTABLE_DENSITY;

    table->perm[xindex] = y; table->perm[yindex] = x;
    table->invperm[x] = yindex; table->invperm[y] = xindex;

    table->keys += newxkeys + newykeys - oldxkeys - oldykeys;

    return(table->keys - table->isolated);

cuddSwapOutOfMem:
    (void) fprintf(table->err,"Error: cuddSwapInPlace out of memory\n");

    return (0);

}